

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O0

void __thiscall
reflect_object_class_test_DefaultConstructor_Test::TestBody
          (reflect_object_class_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  undefined1 *puVar8;
  long lVar9;
  AssertionResult gtest_ar_60;
  AssertionResult gtest_ar_59;
  value ret_1;
  AssertionResult gtest_ar_58;
  method m_1;
  type_id method_ids_1 [1];
  AssertionResult gtest_ar_57;
  AssertionResult gtest_ar_56;
  value e_1;
  AssertionResult gtest_ar_55;
  AssertionResult gtest_ar_54;
  value d_1;
  AssertionResult gtest_ar_53;
  object obj_1;
  AssertionResult gtest_ar_52;
  constructor ctor_1;
  type_id ctor_ids_1 [2];
  value args_1 [2];
  AssertionResult gtest_ar_51;
  AssertionResult gtest_ar_50;
  value ret;
  AssertionResult gtest_ar_49;
  method m;
  type_id method_ids [1];
  AssertionResult gtest_ar_48;
  AssertionResult gtest_ar_47;
  AssertionResult gtest_ar_46;
  value new_e;
  AssertionResult gtest_ar_45;
  AssertionResult gtest_ar_44;
  AssertionResult gtest_ar_43;
  value new_d;
  AssertionResult gtest_ar_42;
  AssertionResult gtest_ar_41;
  value e;
  AssertionResult gtest_ar_40;
  AssertionResult gtest_ar_39;
  value d;
  AssertionResult gtest_ar_38;
  object obj;
  AssertionResult gtest_ar_37;
  constructor ctor;
  type_id ctor_ids [1];
  value args [1];
  AssertionResult gtest_ar_36;
  AssertionResult gtest_ar_35;
  AssertionResult gtest_ar_34;
  AssertionResult gtest_ar_33;
  value new_c;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  AssertionResult gtest_ar_30;
  value new_a;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  value c;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  value b;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  value a;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  attribute e_attr;
  attribute d_attr;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  attribute c_attr;
  attribute b_attr;
  attribute a_attr;
  AssertionResult gtest_ar_13;
  signature s;
  AssertionResult gtest_ar_12;
  method test_func_method;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  type float_type;
  type int_type;
  type str_type;
  type long_type;
  type char_type;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  constructor custom_ctor;
  constructor default_ctor;
  AssertionResult gtest_ar_2;
  klass cls;
  AssertionResult gtest_ar_1;
  hello_world_class hellow_world_cls;
  AssertionResult gtest_ar;
  method_type **in_stack_ffffffffffffedd0;
  method_type **in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffede8;
  undefined1 in_stack_ffffffffffffedef;
  AssertHelper local_c28;
  Message local_c20;
  int local_c18;
  undefined4 local_c14;
  AssertionResult local_c10;
  AssertHelper local_c00;
  Message local_bf8;
  undefined8 local_bf0;
  undefined8 local_be8;
  AssertionResult local_be0;
  undefined8 local_bd0;
  AssertHelper local_bc8;
  Message local_bc0;
  undefined8 local_bb8;
  undefined8 local_bb0;
  AssertionResult local_ba8;
  undefined8 local_b98;
  undefined4 local_b8c;
  AssertHelper local_b88;
  Message local_b80;
  undefined8 local_b78;
  undefined8 local_b70;
  AssertionResult local_b68;
  AssertHelper local_b58;
  Message local_b50;
  undefined8 local_b48;
  undefined8 local_b40;
  AssertionResult local_b38;
  undefined8 local_b28;
  AssertHelper local_b20;
  Message local_b18;
  undefined1 local_b0a;
  undefined1 local_b09;
  AssertionResult local_b08;
  AssertHelper local_af8;
  Message local_af0;
  undefined8 local_ae8;
  undefined8 local_ae0;
  AssertionResult local_ad8;
  undefined8 local_ac8;
  AssertHelper local_ac0;
  Message local_ab8;
  undefined8 local_ab0;
  undefined8 local_aa8;
  AssertionResult local_aa0;
  undefined8 local_a90;
  AssertHelper local_a88;
  Message local_a80;
  undefined8 local_a78;
  undefined8 local_a70;
  AssertionResult local_a68;
  undefined8 local_a58;
  undefined8 local_a50;
  undefined8 local_a48;
  undefined8 local_a40;
  AssertHelper local_a30;
  Message local_a28;
  int local_a20;
  undefined4 local_a1c;
  AssertionResult local_a18;
  AssertHelper local_a08;
  Message local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  AssertionResult local_9e8;
  undefined8 local_9d8;
  AssertHelper local_9d0;
  Message local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  AssertionResult local_9b0;
  undefined8 local_9a0;
  undefined4 local_994;
  AssertHelper local_990;
  Message local_988;
  undefined8 local_980;
  undefined8 local_978;
  AssertionResult local_970;
  AssertHelper local_960;
  Message local_958;
  undefined8 local_950;
  undefined8 local_948;
  AssertionResult local_940;
  AssertHelper local_930;
  Message local_928;
  long local_920;
  undefined8 local_918;
  AssertionResult local_910;
  undefined8 local_900;
  AssertHelper local_8f8;
  Message local_8f0;
  undefined1 local_8e2;
  undefined1 local_8e1;
  AssertionResult local_8e0;
  AssertHelper local_8d0;
  Message local_8c8;
  undefined8 local_8c0;
  undefined8 local_8b8;
  AssertionResult local_8b0;
  AssertHelper local_8a0;
  Message local_898;
  undefined1 local_88a;
  undefined1 local_889;
  AssertionResult local_888;
  undefined8 local_878;
  AssertHelper local_870;
  Message local_868;
  undefined8 local_860;
  undefined8 local_858;
  AssertionResult local_850;
  AssertHelper local_840;
  Message local_838;
  undefined8 local_830;
  undefined8 local_828;
  AssertionResult local_820;
  undefined8 local_810;
  AssertHelper local_808;
  Message local_800;
  undefined1 local_7f2;
  undefined1 local_7f1;
  AssertionResult local_7f0;
  AssertHelper local_7e0;
  Message local_7d8;
  undefined8 local_7d0;
  undefined8 local_7c8;
  AssertionResult local_7c0;
  undefined8 local_7b0;
  AssertHelper local_7a8;
  Message local_7a0;
  undefined8 local_798;
  undefined8 local_790;
  AssertionResult local_788;
  undefined8 local_778;
  AssertHelper local_770;
  Message local_768;
  undefined8 local_760;
  undefined8 local_758;
  AssertionResult local_750;
  undefined8 local_740;
  undefined4 local_734;
  undefined8 local_730;
  AssertHelper local_728;
  Message local_720;
  undefined1 local_712;
  undefined1 local_711;
  AssertionResult local_710;
  AssertHelper local_700;
  Message local_6f8;
  undefined1 local_6ea;
  undefined1 local_6e9;
  AssertionResult local_6e8;
  AssertHelper local_6d8;
  Message local_6d0;
  undefined8 local_6c8;
  undefined8 local_6c0;
  AssertionResult local_6b8;
  AssertHelper local_6a8;
  Message local_6a0;
  undefined4 local_698;
  undefined4 local_694;
  AssertionResult local_690;
  undefined8 local_680;
  AssertHelper local_678;
  Message local_670;
  undefined4 local_668;
  undefined4 local_664;
  AssertionResult local_660;
  AssertHelper local_650;
  Message local_648;
  undefined8 local_640;
  undefined8 local_638;
  AssertionResult local_630;
  AssertHelper local_620;
  Message local_618;
  undefined4 local_610;
  undefined4 local_60c;
  AssertionResult local_608;
  undefined8 local_5f8;
  AssertHelper local_5f0;
  Message local_5e8;
  undefined1 local_5da;
  undefined1 local_5d9;
  AssertionResult local_5d8;
  AssertHelper local_5c8;
  Message local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  AssertionResult local_5a8;
  undefined8 local_598;
  AssertHelper local_590;
  Message local_588;
  undefined4 local_580;
  undefined4 local_57c;
  AssertionResult local_578;
  AssertHelper local_568;
  Message local_560;
  undefined8 local_558;
  undefined8 local_550;
  AssertionResult local_548;
  undefined8 local_538;
  AssertHelper local_530;
  Message local_528;
  undefined4 local_520;
  undefined4 local_51c;
  AssertionResult local_518;
  AssertHelper local_508;
  Message local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  AssertionResult local_4e8;
  undefined8 local_4d8;
  AssertHelper local_4d0;
  Message local_4c8;
  undefined4 local_4c0;
  undefined4 local_4bc;
  AssertionResult local_4b8;
  AssertHelper local_4a8;
  Message local_4a0;
  undefined4 local_498;
  undefined4 local_494;
  AssertionResult local_490;
  AssertHelper local_480;
  Message local_478;
  undefined8 local_470;
  undefined8 local_468;
  AssertionResult local_460;
  AssertHelper local_450;
  Message local_448;
  undefined8 local_440;
  undefined8 local_438;
  AssertionResult local_430;
  undefined8 local_420;
  undefined8 local_418;
  AssertHelper local_410;
  Message local_408;
  undefined4 local_400;
  undefined4 local_3fc;
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  undefined4 local_3d8;
  undefined4 local_3d4;
  AssertionResult local_3d0;
  AssertHelper local_3c0;
  Message local_3b8;
  undefined4 local_3b0;
  undefined4 local_3ac;
  AssertionResult local_3a8;
  AssertHelper local_398;
  Message local_390;
  undefined8 local_388;
  undefined8 local_380;
  AssertionResult local_378;
  AssertHelper local_368;
  Message local_360;
  undefined8 local_358;
  undefined8 local_350;
  AssertionResult local_348;
  AssertHelper local_338;
  Message local_330;
  undefined8 local_328;
  undefined8 local_320;
  AssertionResult local_318;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined4 local_2e0;
  undefined4 local_2dc;
  AssertionResult local_2d8;
  undefined8 local_2c8;
  AssertHelper local_2c0;
  Message local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  AssertionResult local_2a0;
  undefined8 local_290;
  AssertHelper local_288;
  Message local_280;
  undefined4 local_278;
  undefined4 local_274;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  undefined4 local_250;
  undefined4 local_24c;
  AssertionResult local_248;
  AssertHelper local_238;
  Message local_230;
  undefined8 local_228;
  undefined8 local_220;
  AssertionResult local_218;
  AssertHelper local_208;
  Message local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined8 local_168;
  undefined8 local_160;
  AssertionResult local_158;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  AssertHelper local_120;
  Message local_118;
  undefined8 local_110;
  undefined8 local_108;
  AssertionResult local_100;
  uint local_ec;
  AssertHelper local_e8;
  Message local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  AssertionResult local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  AssertHelper local_a8;
  Message local_a0;
  undefined4 local_98;
  undefined4 local_94;
  AssertionResult local_90;
  undefined8 local_80;
  AssertHelper local_78;
  Message local_70;
  undefined8 *local_68;
  undefined8 local_60;
  AssertionResult local_58;
  undefined8 *local_48;
  AssertHelper local_40;
  Message local_38 [3];
  undefined4 local_20;
  undefined4 local_1c;
  AssertionResult local_18;
  
  local_1c = 0;
  uVar3 = log_policy_format_text();
  uVar4 = log_policy_schedule_sync();
  uVar5 = log_policy_storage_sequential();
  uVar6 = log_policy_stream_stdio(_stdout);
  local_20 = log_configure_impl("metacall",4,uVar3,uVar4,uVar5,uVar6);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
             in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
             (int *)in_stack_ffffffffffffedd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c795);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
               ,0x152,pcVar7);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message((Message *)0x10c7f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c850);
  local_68 = (undefined8 *)operator_new(0x14);
  *local_68 = 0;
  local_68[1] = 0;
  *(undefined4 *)(local_68 + 2) = 0;
  local_60 = 0;
  local_48 = local_68;
  testing::internal::CmpHelperNE<void*,void*>
            ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
             in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10c92d);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
               ,0x157,pcVar7);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x10c990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c9e8);
  local_80 = class_create("HelloWorld",0,local_48,hello_world_class_impl_interface_singleton);
  local_94 = class_increment_reference(local_80);
  local_98 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
             in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
             (int *)in_stack_ffffffffffffedd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10cace);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
               ,0x15b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x10cb31);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cb89);
  local_b0 = constructor_create(0);
  local_b8 = constructor_create(2,0);
  local_d0 = 0;
  local_d8 = local_b0;
  testing::internal::CmpHelperNE<constructor_type*,constructor_type*>
            ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
             in_stack_ffffffffffffede0,(constructor_type **)in_stack_ffffffffffffedd8,
             (constructor_type **)in_stack_ffffffffffffedd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10cc78);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
               ,0x161,pcVar7);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x10ccdb);
  }
  local_ec = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10cd49);
  if (local_ec == 0) {
    local_108 = 0;
    local_110 = local_b8;
    testing::internal::CmpHelperNE<constructor_type*,constructor_type*>
              ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
               in_stack_ffffffffffffede0,(constructor_type **)in_stack_ffffffffffffedd8,
               (constructor_type **)in_stack_ffffffffffffedd0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10ce19);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                 ,0x162,pcVar7);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message((Message *)0x10ce7c);
    }
    local_ec = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ceea);
    if (local_ec == 0) {
      local_128 = type_create(1,"char",0);
      local_130 = type_create(4,"long",0);
      local_138 = type_create(7,"string",0);
      local_140 = type_create(3,"int",0);
      local_148 = type_create(5,"float",0);
      local_160 = 0;
      local_168 = local_128;
      testing::internal::CmpHelperNE<type_type*,type_type*>
                ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                 in_stack_ffffffffffffede0,(type_type **)in_stack_ffffffffffffedd8,
                 (type_type **)in_stack_ffffffffffffedd0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d072);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                   ,0x16a,pcVar7);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        testing::Message::~Message((Message *)0x10d0d5);
      }
      local_ec = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d143);
      if (local_ec == 0) {
        local_190 = 0;
        local_198 = local_130;
        testing::internal::CmpHelperNE<type_type*,type_type*>
                  ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                   in_stack_ffffffffffffede0,(type_type **)in_stack_ffffffffffffedd8,
                   (type_type **)in_stack_ffffffffffffedd0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
        if (!bVar1) {
          testing::Message::Message(&local_1a0);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d213);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                     ,0x16b,pcVar7);
          testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          testing::Message::~Message((Message *)0x10d276);
        }
        local_ec = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d2e4);
        if (local_ec == 0) {
          local_1c0 = 0;
          local_1c8 = local_138;
          testing::internal::CmpHelperNE<type_type*,type_type*>
                    ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                     in_stack_ffffffffffffede0,(type_type **)in_stack_ffffffffffffedd8,
                     (type_type **)in_stack_ffffffffffffedd0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
          if (!bVar1) {
            testing::Message::Message(&local_1d0);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d3b4);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                       ,0x16c,pcVar7);
            testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
            testing::internal::AssertHelper::~AssertHelper(&local_1d8);
            testing::Message::~Message((Message *)0x10d417);
          }
          local_ec = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d485);
          if (local_ec == 0) {
            local_1f0 = 0;
            local_1f8 = local_140;
            testing::internal::CmpHelperNE<type_type*,type_type*>
                      ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                       in_stack_ffffffffffffede0,(type_type **)in_stack_ffffffffffffedd8,
                       (type_type **)in_stack_ffffffffffffedd0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
            if (!bVar1) {
              testing::Message::Message(&local_200);
              pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d555);
              testing::internal::AssertHelper::AssertHelper
                        (&local_208,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                         ,0x16d,pcVar7);
              testing::internal::AssertHelper::operator=(&local_208,&local_200);
              testing::internal::AssertHelper::~AssertHelper(&local_208);
              testing::Message::~Message((Message *)0x10d5b8);
            }
            local_ec = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d626);
            if (local_ec == 0) {
              local_220 = 0;
              local_228 = local_148;
              testing::internal::CmpHelperNE<type_type*,type_type*>
                        ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                         in_stack_ffffffffffffede0,(type_type **)in_stack_ffffffffffffedd8,
                         (type_type **)in_stack_ffffffffffffedd0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
              if (!bVar1) {
                testing::Message::Message(&local_230);
                pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d6f6);
                testing::internal::AssertHelper::AssertHelper
                          (&local_238,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                           ,0x16e,pcVar7);
                testing::internal::AssertHelper::operator=(&local_238,&local_230);
                testing::internal::AssertHelper::~AssertHelper(&local_238);
                testing::Message::~Message((Message *)0x10d759);
              }
              local_ec = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d7c7);
              if (local_ec == 0) {
                constructor_set(local_b8,0,"c",local_128);
                constructor_set(local_b8,1,"l",local_130);
                local_24c = 0;
                local_250 = class_register_constructor(local_80,local_b0);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                           in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
                           (int *)in_stack_ffffffffffffedd0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
                if (!bVar1) {
                  testing::Message::Message(&local_258);
                  pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10d8e3);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_260,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                             ,0x173,pcVar7);
                  testing::internal::AssertHelper::operator=(&local_260,&local_258);
                  testing::internal::AssertHelper::~AssertHelper(&local_260);
                  testing::Message::~Message((Message *)0x10d946);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d99e);
                local_274 = 0;
                local_278 = class_register_constructor(local_80,local_b8);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                           in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
                           (int *)in_stack_ffffffffffffedd0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
                if (!bVar1) {
                  testing::Message::Message(&local_280);
                  pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10da67);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_288,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                             ,0x174,pcVar7);
                  testing::internal::AssertHelper::operator=(&local_288,&local_280);
                  testing::internal::AssertHelper::~AssertHelper(&local_288);
                  testing::Message::~Message((Message *)0x10daca);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10db22);
                local_2b0 = method_create(local_80,"test_func",0,0,0,0,0);
                local_2a8 = 0;
                local_290 = local_2b0;
                testing::internal::CmpHelperNE<method_type*,method_type*>
                          ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                           in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,
                           in_stack_ffffffffffffedd0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
                if (!bVar1) {
                  testing::Message::Message(&local_2b8);
                  pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10dc12);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2c0,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                             ,0x179,pcVar7);
                  testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_2c0);
                  testing::Message::~Message((Message *)0x10dc75);
                }
                local_ec = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dce3);
                if (local_ec == 0) {
                  local_2c8 = method_signature(local_290);
                  signature_set_return(local_2c8,local_138);
                  local_2dc = 0;
                  local_2e0 = class_register_method(local_80,local_290);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                             in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
                             (int *)in_stack_ffffffffffffedd0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
                  if (!bVar1) {
                    testing::Message::Message(&local_2e8);
                    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10dde8);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2f0,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                               ,0x17f,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
                    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
                    testing::Message::~Message((Message *)0x10de4b);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dea3);
                  local_2f8 = attribute_create(local_80,"a",local_140,0);
                  local_300 = attribute_create(local_80,"b",local_148,0,0);
                  local_308 = attribute_create(local_80,"c",local_138,0,0);
                  local_320 = 0;
                  local_328 = local_2f8;
                  testing::internal::CmpHelperNE<attribute_type*,attribute_type*>
                            ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8),
                             in_stack_ffffffffffffede0,(attribute_type **)in_stack_ffffffffffffedd8,
                             (attribute_type **)in_stack_ffffffffffffedd0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
                  if (!bVar1) {
                    testing::Message::Message(&local_330);
                    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x10e00c);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_338,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                               ,0x186,pcVar7);
                    testing::internal::AssertHelper::operator=(&local_338,&local_330);
                    testing::internal::AssertHelper::~AssertHelper(&local_338);
                    testing::Message::~Message((Message *)0x10e06f);
                  }
                  local_ec = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e0dd);
                  if (local_ec == 0) {
                    local_350 = 0;
                    local_358 = local_300;
                    testing::internal::CmpHelperNE<attribute_type*,attribute_type*>
                              ((char *)CONCAT17(in_stack_ffffffffffffedef,in_stack_ffffffffffffede8)
                               ,in_stack_ffffffffffffede0,
                               (attribute_type **)in_stack_ffffffffffffedd8,
                               (attribute_type **)in_stack_ffffffffffffedd0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
                    if (!bVar1) {
                      testing::Message::Message(&local_360);
                      pcVar7 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)0x10e1ad);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_368,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                 ,0x187,pcVar7);
                      testing::internal::AssertHelper::operator=(&local_368,&local_360);
                      testing::internal::AssertHelper::~AssertHelper(&local_368);
                      testing::Message::~Message((Message *)0x10e210);
                    }
                    local_ec = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e27e);
                    if (local_ec == 0) {
                      local_380 = 0;
                      local_388 = local_308;
                      testing::internal::CmpHelperNE<attribute_type*,attribute_type*>
                                ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                 in_stack_ffffffffffffede0,
                                 (attribute_type **)in_stack_ffffffffffffedd8,
                                 (attribute_type **)in_stack_ffffffffffffedd0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_378);
                      if (!bVar1) {
                        testing::Message::Message(&local_390);
                        pcVar7 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)0x10e34e);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_398,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                   ,0x188,pcVar7);
                        testing::internal::AssertHelper::operator=(&local_398,&local_390);
                        testing::internal::AssertHelper::~AssertHelper(&local_398);
                        testing::Message::~Message((Message *)0x10e3b1);
                      }
                      local_ec = (uint)!bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e41f);
                      if (local_ec == 0) {
                        local_3ac = 0;
                        local_3b0 = class_register_static_attribute(local_80,local_2f8);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                    in_stack_ffffffffffffede8),
                                   in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
                                   (int *)in_stack_ffffffffffffedd0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
                        if (!bVar1) {
                          testing::Message::Message(&local_3b8);
                          pcVar7 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)0x10e4fa);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_3c0,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                     ,0x18a,pcVar7);
                          testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
                          testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                          testing::Message::~Message((Message *)0x10e55d);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e5b5);
                        local_3d4 = 0;
                        local_3d8 = class_register_static_attribute(local_80,local_300);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                    in_stack_ffffffffffffede8),
                                   in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
                                   (int *)in_stack_ffffffffffffedd0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d0);
                        if (!bVar1) {
                          testing::Message::Message(&local_3e0);
                          pcVar7 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)0x10e67e);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_3e8,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                     ,0x18b,pcVar7);
                          testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
                          testing::internal::AssertHelper::~AssertHelper(&local_3e8);
                          testing::Message::~Message((Message *)0x10e6e1);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e739);
                        local_3fc = 0;
                        local_400 = class_register_static_attribute(local_80,local_308);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                    in_stack_ffffffffffffede8),
                                   in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
                                   (int *)in_stack_ffffffffffffedd0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
                        if (!bVar1) {
                          testing::Message::Message(&local_408);
                          pcVar7 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)0x10e802);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_410,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                     ,0x18c,pcVar7);
                          testing::internal::AssertHelper::operator=(&local_410,&local_408);
                          testing::internal::AssertHelper::~AssertHelper(&local_410);
                          testing::Message::~Message((Message *)0x10e865);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e8bd);
                        local_418 = attribute_create(local_80,"d",local_128,0);
                        local_420 = attribute_create(local_80,"e",local_130,0,0);
                        local_438 = 0;
                        local_440 = local_418;
                        testing::internal::CmpHelperNE<attribute_type*,attribute_type*>
                                  ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                    in_stack_ffffffffffffede8),
                                   in_stack_ffffffffffffede0,
                                   (attribute_type **)in_stack_ffffffffffffedd8,
                                   (attribute_type **)in_stack_ffffffffffffedd0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_430);
                        if (!bVar1) {
                          testing::Message::Message(&local_448);
                          pcVar7 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)0x10e9ef);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_450,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                     ,0x192,pcVar7);
                          testing::internal::AssertHelper::operator=(&local_450,&local_448);
                          testing::internal::AssertHelper::~AssertHelper(&local_450);
                          testing::Message::~Message((Message *)0x10ea52);
                        }
                        local_ec = (uint)!bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10eac0);
                        if (local_ec == 0) {
                          local_468 = 0;
                          local_470 = local_420;
                          testing::internal::CmpHelperNE<attribute_type*,attribute_type*>
                                    ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                      in_stack_ffffffffffffede8),
                                     in_stack_ffffffffffffede0,
                                     (attribute_type **)in_stack_ffffffffffffedd8,
                                     (attribute_type **)in_stack_ffffffffffffedd0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_460);
                          if (!bVar1) {
                            testing::Message::Message(&local_478);
                            pcVar7 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)0x10eb90);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_480,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                       ,0x193,pcVar7);
                            testing::internal::AssertHelper::operator=(&local_480,&local_478);
                            testing::internal::AssertHelper::~AssertHelper(&local_480);
                            testing::Message::~Message((Message *)0x10ebf3);
                          }
                          local_ec = (uint)!bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ec61);
                          if (local_ec == 0) {
                            local_494 = 0;
                            local_498 = class_register_attribute(local_80,local_418);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                        in_stack_ffffffffffffede8),
                                       in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
                                       (int *)in_stack_ffffffffffffedd0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_490);
                            if (!bVar1) {
                              testing::Message::Message(&local_4a0);
                              pcVar7 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)0x10ed3c);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_4a8,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                         ,0x195,pcVar7);
                              testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
                              testing::internal::AssertHelper::~AssertHelper(&local_4a8);
                              testing::Message::~Message((Message *)0x10ed9f);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10edf7);
                            local_4bc = 0;
                            local_4c0 = class_register_attribute(local_80,local_420);
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                        in_stack_ffffffffffffede8),
                                       in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
                                       (int *)in_stack_ffffffffffffedd0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
                            if (!bVar1) {
                              testing::Message::Message(&local_4c8);
                              pcVar7 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)0x10eec0);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_4d0,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                         ,0x196,pcVar7);
                              testing::internal::AssertHelper::operator=(&local_4d0,&local_4c8);
                              testing::internal::AssertHelper::~AssertHelper(&local_4d0);
                              testing::Message::~Message((Message *)0x10ef23);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ef7b);
                            local_4f8 = class_static_get(local_80,"a");
                            local_4f0 = 0;
                            local_4d8 = local_4f8;
                            testing::internal::CmpHelperNE<void*,void*>
                                      ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                        in_stack_ffffffffffffede8),
                                       in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,
                                       in_stack_ffffffffffffedd0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
                            if (!bVar1) {
                              testing::Message::Message(&local_500);
                              pcVar7 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)0x10f055);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_508,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                         ,0x19b,pcVar7);
                              testing::internal::AssertHelper::operator=(&local_508,&local_500);
                              testing::internal::AssertHelper::~AssertHelper(&local_508);
                              testing::Message::~Message((Message *)0x10f0b8);
                            }
                            local_ec = (uint)!bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f126);
                            if (local_ec == 0) {
                              local_51c = 0;
                              local_520 = value_to_int(local_4d8);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                          in_stack_ffffffffffffede8),
                                         in_stack_ffffffffffffede0,(int *)in_stack_ffffffffffffedd8,
                                         (int *)in_stack_ffffffffffffedd0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_518);
                              if (!bVar1) {
                                testing::Message::Message(&local_528);
                                pcVar7 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)0x10f1f9);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_530,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                           ,0x19c,pcVar7);
                                testing::internal::AssertHelper::operator=(&local_530,&local_528);
                                testing::internal::AssertHelper::~AssertHelper(&local_530);
                                testing::Message::~Message((Message *)0x10f25c);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x10f2b4);
                              value_type_destroy(local_4d8);
                              local_558 = class_static_get(local_80,"b");
                              local_550 = 0;
                              local_538 = local_558;
                              testing::internal::CmpHelperNE<void*,void*>
                                        ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                          in_stack_ffffffffffffede8),
                                         in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,
                                         in_stack_ffffffffffffedd0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_548);
                              if (!bVar1) {
                                testing::Message::Message(&local_560);
                                pcVar7 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)0x10f39b);
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_568,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                           ,0x1a0,pcVar7);
                                testing::internal::AssertHelper::operator=(&local_568,&local_560);
                                testing::internal::AssertHelper::~AssertHelper(&local_568);
                                testing::Message::~Message((Message *)0x10f3fe);
                              }
                              local_ec = (uint)!bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)0x10f46c);
                              if (local_ec == 0) {
                                local_57c = 0;
                                local_580 = value_to_float(local_538);
                                testing::internal::EqHelper::Compare<float,_float,_nullptr>
                                          ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                            in_stack_ffffffffffffede8),
                                           in_stack_ffffffffffffede0,
                                           (float *)in_stack_ffffffffffffedd8,
                                           (float *)in_stack_ffffffffffffedd0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_578);
                                if (!bVar1) {
                                  testing::Message::Message(&local_588);
                                  pcVar7 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)0x10f541);
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_590,kNonFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                             ,0x1a1,pcVar7);
                                  testing::internal::AssertHelper::operator=(&local_590,&local_588);
                                  testing::internal::AssertHelper::~AssertHelper(&local_590);
                                  testing::Message::~Message((Message *)0x10f5a4);
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)0x10f5fc);
                                value_type_destroy(local_538);
                                local_5b8 = class_static_get(local_80,"c");
                                local_5b0 = 0;
                                local_598 = local_5b8;
                                testing::internal::CmpHelperNE<void*,void*>
                                          ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                            in_stack_ffffffffffffede8),
                                           in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,
                                           in_stack_ffffffffffffedd0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5a8);
                                if (!bVar1) {
                                  testing::Message::Message(&local_5c0);
                                  pcVar7 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)0x10f6e3);
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_5c8,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                             ,0x1a5,pcVar7);
                                  testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
                                  testing::internal::AssertHelper::~AssertHelper(&local_5c8);
                                  testing::Message::~Message((Message *)0x10f746);
                                }
                                local_ec = (uint)!bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)0x10f7b4);
                                if (local_ec == 0) {
                                  local_5d9 = 0;
                                  puVar8 = (undefined1 *)value_to_string(local_598);
                                  local_5da = *puVar8;
                                  testing::internal::EqHelper::Compare<char,_char,_nullptr>
                                            ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                              in_stack_ffffffffffffede8),
                                             in_stack_ffffffffffffede0,
                                             (char *)in_stack_ffffffffffffedd8,
                                             (char *)in_stack_ffffffffffffedd0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    (&local_5d8);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_5e8);
                                    pcVar7 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)0x10f886);
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_5f0,kNonFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                               ,0x1a6,pcVar7);
                                    testing::internal::AssertHelper::operator=
                                              (&local_5f0,&local_5e8);
                                    testing::internal::AssertHelper::~AssertHelper(&local_5f0);
                                    testing::Message::~Message((Message *)0x10f8e9);
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)0x10f941);
                                  value_type_destroy(local_598);
                                  local_5f8 = value_create_int(0x4d2);
                                  local_60c = 0;
                                  local_610 = class_static_set(local_80,"a",local_5f8);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                              in_stack_ffffffffffffede8),
                                             in_stack_ffffffffffffede0,
                                             (int *)in_stack_ffffffffffffedd8,
                                             (int *)in_stack_ffffffffffffedd0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    (&local_608);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_618);
                                    pcVar7 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)0x10fa30);
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_620,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                               ,0x1aa,pcVar7);
                                    testing::internal::AssertHelper::operator=
                                              (&local_620,&local_618);
                                    testing::internal::AssertHelper::~AssertHelper(&local_620);
                                    testing::Message::~Message((Message *)0x10fa93);
                                  }
                                  local_ec = (uint)!bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)0x10fb01);
                                  if (local_ec == 0) {
                                    local_640 = class_static_get(local_80,"a");
                                    local_638 = 0;
                                    local_4d8 = local_640;
                                    testing::internal::CmpHelperNE<void*,void*>
                                              ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                in_stack_ffffffffffffede8),
                                               in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,
                                               in_stack_ffffffffffffedd0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      (&local_630);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_648);
                                      pcVar7 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)0x10fbed);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_650,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                 ,0x1ac,pcVar7);
                                      testing::internal::AssertHelper::operator=
                                                (&local_650,&local_648);
                                      testing::internal::AssertHelper::~AssertHelper(&local_650);
                                      testing::Message::~Message((Message *)0x10fc50);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)0x10fca8);
                                    local_664 = 0x4d2;
                                    local_668 = value_to_int(local_4d8);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                in_stack_ffffffffffffede8),
                                               in_stack_ffffffffffffede0,
                                               (int *)in_stack_ffffffffffffedd8,
                                               (int *)in_stack_ffffffffffffedd0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      (&local_660);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_670);
                                      pcVar7 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)0x10fd69);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_678,kNonFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                 ,0x1ad,pcVar7);
                                      testing::internal::AssertHelper::operator=
                                                (&local_678,&local_670);
                                      testing::internal::AssertHelper::~AssertHelper(&local_678);
                                      testing::Message::~Message((Message *)0x10fdcc);
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)0x10fe24);
                                    value_type_destroy(local_4d8);
                                    value_type_destroy(local_5f8);
                                    local_680 = value_create_string("hi",2);
                                    local_694 = 0;
                                    local_698 = class_static_set(local_80,"c",local_680);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                in_stack_ffffffffffffede8),
                                               in_stack_ffffffffffffede0,
                                               (int *)in_stack_ffffffffffffedd8,
                                               (int *)in_stack_ffffffffffffedd0);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      (&local_690);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_6a0);
                                      pcVar7 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)0x10ff27);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_6a8,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                 ,0x1b3,pcVar7);
                                      testing::internal::AssertHelper::operator=
                                                (&local_6a8,&local_6a0);
                                      testing::internal::AssertHelper::~AssertHelper(&local_6a8);
                                      testing::Message::~Message((Message *)0x10ff8a);
                                    }
                                    local_ec = (uint)!bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)0x10fff8);
                                    if (local_ec == 0) {
                                      local_6c8 = class_static_get(local_80,"c");
                                      local_6c0 = 0;
                                      local_598 = local_6c8;
                                      testing::internal::CmpHelperNE<void*,void*>
                                                ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                  in_stack_ffffffffffffede8),
                                                 in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8
                                                 ,in_stack_ffffffffffffedd0);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        (&local_6b8);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_6d0);
                                        pcVar7 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)0x1100e4);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_6d8,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1b5,pcVar7);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_6d8,&local_6d0);
                                        testing::internal::AssertHelper::~AssertHelper(&local_6d8);
                                        testing::Message::~Message((Message *)0x110147);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)0x11019f);
                                      local_6e9 = 0x68;
                                      puVar8 = (undefined1 *)value_to_string(local_598);
                                      local_6ea = *puVar8;
                                      testing::internal::EqHelper::Compare<char,_char,_nullptr>
                                                ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                  in_stack_ffffffffffffede8),
                                                 in_stack_ffffffffffffede0,
                                                 (char *)in_stack_ffffffffffffedd8,
                                                 (char *)in_stack_ffffffffffffedd0);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        (&local_6e8);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_6f8);
                                        pcVar7 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)0x11025f);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_700,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1b6,pcVar7);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_700,&local_6f8);
                                        testing::internal::AssertHelper::~AssertHelper(&local_700);
                                        testing::Message::~Message((Message *)0x1102c2);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)0x11031a);
                                      local_711 = 0x69;
                                      lVar9 = value_to_string(local_598);
                                      local_712 = *(undefined1 *)(lVar9 + 1);
                                      testing::internal::EqHelper::Compare<char,_char,_nullptr>
                                                ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                  in_stack_ffffffffffffede8),
                                                 in_stack_ffffffffffffede0,
                                                 (char *)in_stack_ffffffffffffedd8,
                                                 (char *)in_stack_ffffffffffffedd0);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        (&local_710);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_720);
                                        pcVar7 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)0x1103db);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_728,kNonFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1b7,pcVar7);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_728,&local_720);
                                        testing::internal::AssertHelper::~AssertHelper(&local_728);
                                        testing::Message::~Message((Message *)0x11043e);
                                      }
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)0x110496);
                                      value_type_destroy(local_598);
                                      value_type_destroy(local_680);
                                      local_730 = 0;
                                      local_734 = 0x14;
                                      local_758 = class_constructor(local_80,&local_734,0);
                                      local_760 = local_b0;
                                      local_740 = local_758;
                                      testing::internal::EqHelper::
                                      Compare<constructor_type_*,_constructor_type_*,_nullptr>
                                                ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                  in_stack_ffffffffffffede8),
                                                 in_stack_ffffffffffffede0,
                                                 (constructor_type **)in_stack_ffffffffffffedd8,
                                                 (constructor_type **)in_stack_ffffffffffffedd0);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        (&local_750);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_768);
                                        pcVar7 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)0x1105aa);
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_770,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1c8,pcVar7);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_770,&local_768);
                                        testing::internal::AssertHelper::~AssertHelper(&local_770);
                                        testing::Message::~Message((Message *)0x11060d);
                                      }
                                      local_ec = (uint)!bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)0x11067b);
                                      if (local_ec == 0) {
                                        local_798 = class_new(local_80,"helloWorldObj",local_740,
                                                              &local_730,0);
                                        local_790 = 0;
                                        local_778 = local_798;
                                        testing::internal::CmpHelperNE<object_type*,object_type*>
                                                  ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                    in_stack_ffffffffffffede8),
                                                   in_stack_ffffffffffffede0,
                                                   (object_type **)in_stack_ffffffffffffedd8,
                                                   (object_type **)in_stack_ffffffffffffedd0);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          (&local_788);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_7a0);
                                          pcVar7 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)0x11077c);
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_7a8,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1cb,pcVar7);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_7a8,&local_7a0);
                                          testing::internal::AssertHelper::~AssertHelper(&local_7a8)
                                          ;
                                          testing::Message::~Message((Message *)0x1107df);
                                        }
                                        local_ec = (uint)!bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)0x11084d);
                                        if (local_ec == 0) {
                                          local_7d0 = object_get(local_778,"d");
                                          local_7c8 = 0;
                                          local_7b0 = local_7d0;
                                          testing::internal::CmpHelperNE<void*,void*>
                                                    ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                      in_stack_ffffffffffffede8),
                                                     in_stack_ffffffffffffede0,
                                                     in_stack_ffffffffffffedd8,
                                                     in_stack_ffffffffffffedd0);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            (&local_7c0);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_7d8);
                                            pcVar7 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)0x110939);
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_7e0,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1d0,pcVar7);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_7e0,&local_7d8);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_7e0);
                                            testing::Message::~Message((Message *)0x11099c);
                                          }
                                          local_ec = (uint)!bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)0x110a0a);
                                          if (local_ec == 0) {
                                            local_7f1 = 100;
                                            local_7f2 = value_to_char(local_7b0);
                                            testing::internal::EqHelper::
                                            Compare<char,_char,_nullptr>
                                                      ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                        in_stack_ffffffffffffede8),
                                                       in_stack_ffffffffffffede0,
                                                       (char *)in_stack_ffffffffffffedd8,
                                                       (char *)in_stack_ffffffffffffedd0);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              (&local_7f0);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_800);
                                              pcVar7 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)0x110ada);
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_808,kNonFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1d1,pcVar7);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_808,&local_800);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_808);
                                              testing::Message::~Message((Message *)0x110b3d);
                                            }
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)0x110b95);
                                            value_type_destroy(local_7b0);
                                            local_830 = object_get(local_778,"e");
                                            local_828 = 0;
                                            local_810 = local_830;
                                            testing::internal::CmpHelperNE<void*,void*>
                                                      ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                        in_stack_ffffffffffffede8),
                                                       in_stack_ffffffffffffede0,
                                                       in_stack_ffffffffffffedd8,
                                                       in_stack_ffffffffffffedd0);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              (&local_820);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_838);
                                              pcVar7 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)0x110c7c);
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_840,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1d5,pcVar7);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_840,&local_838);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_840);
                                              testing::Message::~Message((Message *)0x110cdf);
                                            }
                                            local_ec = (uint)!bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)0x110d4d);
                                            if (local_ec == 0) {
                                              local_858 = 0x37;
                                              local_860 = value_to_long(local_810);
                                              testing::internal::EqHelper::
                                              Compare<long,_long,_nullptr>
                                                        ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                          in_stack_ffffffffffffede8)
                                                         ,in_stack_ffffffffffffede0,
                                                         (long *)in_stack_ffffffffffffedd8,
                                                         (long *)in_stack_ffffffffffffedd0);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool(&local_850);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_868);
                                                pcVar7 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x110e22);
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_870,kNonFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1d6,pcVar7);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_870,&local_868);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_870);
                                                testing::Message::~Message((Message *)0x110e85);
                                              }
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)0x110edd);
                                              value_type_destroy(local_810);
                                              local_878 = value_create_char(0x4d);
                                              local_889 = 0;
                                              local_88a = object_set(local_778,"d",local_878);
                                              testing::internal::EqHelper::
                                              Compare<char,_char,_nullptr>
                                                        ((char *)CONCAT17(in_stack_ffffffffffffedef,
                                                                          in_stack_ffffffffffffede8)
                                                         ,in_stack_ffffffffffffede0,
                                                         (char *)in_stack_ffffffffffffedd8,
                                                         (char *)in_stack_ffffffffffffedd0);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool(&local_888);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_898);
                                                pcVar7 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)0x110fc9);
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_8a0,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1da,pcVar7);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_8a0,&local_898);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_8a0);
                                                testing::Message::~Message((Message *)0x11102c);
                                              }
                                              local_ec = (uint)!bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)0x11109a);
                                              if (local_ec == 0) {
                                                local_8c0 = object_get(local_778,"d");
                                                local_8b8 = 0;
                                                local_7b0 = local_8c0;
                                                testing::internal::CmpHelperNE<void*,void*>
                                                          ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  in_stack_ffffffffffffedd8,
                                                  in_stack_ffffffffffffedd0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool(&local_8b0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_8c8);
                                                  pcVar7 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)0x111186);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_8d0,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1dc,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_8d0,&local_8c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_8d0);
                                                  testing::Message::~Message((Message *)0x1111e9);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)0x111241);
                                                local_8e1 = 0x4d;
                                                local_8e2 = value_to_char(local_7b0);
                                                testing::internal::EqHelper::
                                                Compare<char,_char,_nullptr>
                                                          ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  (char *)in_stack_ffffffffffffedd8,
                                                  (char *)in_stack_ffffffffffffedd0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool(&local_8e0);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_8f0);
                                                  pcVar7 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)0x1112ff);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_8f8,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1dd,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_8f8,&local_8f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_8f8);
                                                  testing::Message::~Message((Message *)0x111362);
                                                }
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)0x1113ba);
                                                value_type_destroy(local_7b0);
                                                value_type_destroy(local_878);
                                                local_900 = value_create_long(0x4d2);
                                                local_918 = 0;
                                                iVar2 = object_set(local_778,"e",local_900);
                                                local_920 = (long)iVar2;
                                                testing::internal::EqHelper::
                                                Compare<long,_long,_nullptr>
                                                          ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  (long *)in_stack_ffffffffffffedd8,
                                                  (long *)in_stack_ffffffffffffedd0);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool(&local_910);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_928);
                                                  pcVar7 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)0x1114ba);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_930,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1e2,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_930,&local_928);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_930);
                                                  testing::Message::~Message((Message *)0x11151d);
                                                }
                                                local_ec = (uint)!bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)0x11158b);
                                                if (local_ec == 0) {
                                                  local_950 = object_get(local_778,"e");
                                                  local_948 = 0;
                                                  local_810 = local_950;
                                                  testing::internal::CmpHelperNE<void*,void*>
                                                            ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  in_stack_ffffffffffffedd8,
                                                  in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_940);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_958);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x111677);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_960,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1e4,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_960,&local_958);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_960);
                                                  testing::Message::~Message((Message *)0x1116da);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x111732);
                                                  local_978 = 0x4d2;
                                                  local_980 = value_to_long(local_810);
                                                  testing::internal::EqHelper::
                                                  Compare<long,_long,_nullptr>
                                                            ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  (long *)in_stack_ffffffffffffedd8,
                                                  (long *)in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_970);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_988);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x1117f5);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_990,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1e5,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_990,&local_988);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_990);
                                                  testing::Message::~Message((Message *)0x111858);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x1118b0);
                                                  value_type_destroy(local_810);
                                                  value_type_destroy(local_900);
                                                  local_994 = 0x14;
                                                  local_9b8 = class_method(local_80,"test_func",7,
                                                                           &local_994,0);
                                                  local_9c0 = local_290;
                                                  local_9a0 = local_9b8;
                                                  testing::internal::EqHelper::
                                                  Compare<method_type_*,_method_type_*,_nullptr>
                                                            ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  in_stack_ffffffffffffedd8,
                                                  in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_9b0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_9c8);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x1119c5);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_9d0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1f1,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_9d0,&local_9c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_9d0);
                                                  testing::Message::~Message((Message *)0x111a28);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x111a96);
                                                  if (local_ec == 0) {
                                                    local_9f8 = object_call(local_778,local_9a0,
                                                                            &local_730,0);
                                                    local_9f0 = 0;
                                                    local_9d8 = local_9f8;
                                                    testing::internal::CmpHelperNE<void*,void*>
                                                              ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  in_stack_ffffffffffffedd8,
                                                  in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_9e8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_a00);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x111b8f);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_a08,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1f5,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a08,&local_a00);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a08);
                                                  testing::Message::~Message((Message *)0x111bf2);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x111c60);
                                                  if (local_ec == 0) {
                                                    local_a1c = 0;
                                                    pcVar7 = (char *)value_to_string(local_9d8);
                                                    local_a20 = strcmp(pcVar7,"Hello World");
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  (int *)in_stack_ffffffffffffedd8,
                                                  (int *)in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_a18);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_a28);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x111d42);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_a30,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x1f7,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a30,&local_a28);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a30);
                                                  testing::Message::~Message((Message *)0x111da5);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x111e13);
                                                  if (local_ec == 0) {
                                                    value_type_destroy(local_9d8);
                                                    object_destroy(local_778);
                                                    local_a48 = value_create_char(0x46);
                                                    local_a40 = value_create_long(0xd6b);
                                                    local_a50 = 0x400000001;
                                                    local_a70 = class_constructor(local_80,&
                                                  local_a50,2);
                                                  local_a78 = local_b8;
                                                  local_a58 = local_a70;
                                                  testing::internal::EqHelper::
                                                  Compare<constructor_type_*,_constructor_type_*,_nullptr>
                                                            ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  (constructor_type **)in_stack_ffffffffffffedd8,
                                                  (constructor_type **)in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_a68);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_a80);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x111f59);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_a88,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x20e,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a88,&local_a80);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a88);
                                                  testing::Message::~Message((Message *)0x111fbc);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x11202a);
                                                  if (local_ec == 0) {
                                                    local_ab0 = class_new(local_80,"helloWorldObj",
                                                                          local_a58,&local_a48,2);
                                                    local_aa8 = 0;
                                                    local_a90 = local_ab0;
                                                    testing::internal::
                                                    CmpHelperNE<object_type*,object_type*>
                                                              ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  (object_type **)in_stack_ffffffffffffedd8,
                                                  (object_type **)in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_aa0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_ab8);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x11212c);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_ac0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x211,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_ac0,&local_ab8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_ac0);
                                                  testing::Message::~Message((Message *)0x11218f);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x1121fd);
                                                  if (local_ec == 0) {
                                                    value_type_destroy(local_a48);
                                                    value_type_destroy(local_a40);
                                                    local_ae8 = object_get(local_a90,"d");
                                                    local_ae0 = 0;
                                                    local_ac8 = local_ae8;
                                                    testing::internal::CmpHelperNE<void*,void*>
                                                              ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  in_stack_ffffffffffffedd8,
                                                  in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_ad8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_af0);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x112303);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_af8,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x219,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_af8,&local_af0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_af8);
                                                  testing::Message::~Message((Message *)0x112366);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x1123d4);
                                                  if (local_ec == 0) {
                                                    local_b09 = 0x46;
                                                    local_b0a = value_to_char(local_ac8);
                                                    testing::internal::EqHelper::
                                                    Compare<char,_char,_nullptr>
                                                              ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  (char *)in_stack_ffffffffffffedd8,
                                                  (char *)in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_b08);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_b18);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x1124a4);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_b20,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x21a,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_b20,&local_b18);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_b20);
                                                  testing::Message::~Message((Message *)0x112507);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x11255f);
                                                  value_type_destroy(local_ac8);
                                                  local_b48 = object_get(local_a90,"e");
                                                  local_b40 = 0;
                                                  local_b28 = local_b48;
                                                  testing::internal::CmpHelperNE<void*,void*>
                                                            ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  in_stack_ffffffffffffedd8,
                                                  in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_b38);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_b50);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x112640);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_b58,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x21e,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_b58,&local_b50);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_b58);
                                                  testing::Message::~Message((Message *)0x11269d);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x11270b);
                                                  if (local_ec == 0) {
                                                    local_b70 = 0xd6b;
                                                    local_b78 = value_to_long(local_b28);
                                                    testing::internal::EqHelper::
                                                    Compare<long,_long,_nullptr>
                                                              ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  (long *)in_stack_ffffffffffffedd8,
                                                  (long *)in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_b68);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_b80);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x1127d4);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_b88,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x21f,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_b88,&local_b80);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_b88);
                                                  testing::Message::~Message((Message *)0x112831);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x112889);
                                                  value_type_destroy(local_b28);
                                                  local_b8c = 0x14;
                                                  local_bb0 = class_method(local_80,"test_func",7,
                                                                           &local_b8c,0);
                                                  local_bb8 = local_290;
                                                  local_b98 = local_bb0;
                                                  testing::internal::EqHelper::
                                                  Compare<method_type_*,_method_type_*,_nullptr>
                                                            ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  in_stack_ffffffffffffedd8,
                                                  in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_ba8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_bc0);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x112985);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_bc8,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x22a,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_bc8,&local_bc0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_bc8);
                                                  testing::Message::~Message((Message *)0x1129e2);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x112a50);
                                                  if (local_ec == 0) {
                                                    local_bf0 = object_call(local_a90,local_b98,
                                                                            &local_a48,0);
                                                    local_be8 = 0;
                                                    local_bd0 = local_bf0;
                                                    testing::internal::CmpHelperNE<void*,void*>
                                                              ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),
                                                  in_stack_ffffffffffffede0,
                                                  in_stack_ffffffffffffedd8,
                                                  in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(&local_be0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_bf8);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x112b3d);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_c00,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x22e,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_c00,&local_bf8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_c00);
                                                  testing::Message::~Message((Message *)0x112b9a);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x112c08);
                                                  if (local_ec == 0) {
                                                    local_c14 = 0;
                                                    pcVar7 = (char *)value_to_string(local_bd0);
                                                    local_c18 = strcmp(pcVar7,"Hello World");
                                                    this_00 = &local_c10;
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((char *)CONCAT17(
                                                  in_stack_ffffffffffffedef,
                                                  in_stack_ffffffffffffede8),&this_00->success_,
                                                  (int *)in_stack_ffffffffffffedd8,
                                                  (int *)in_stack_ffffffffffffedd0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool(this_00);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_c20);
                                                    pcVar7 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             0x112cde);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_c28,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
                                                  ,0x230,pcVar7);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_c28,&local_c20);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_c28);
                                                  testing::Message::~Message((Message *)0x112d3b);
                                                  }
                                                  local_ec = (uint)!bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)0x112da9);
                                                  if (local_ec == 0) {
                                                    value_type_destroy(local_bd0);
                                                    object_destroy(local_a90);
                                                    type_destroy(local_128);
                                                    type_destroy(local_130);
                                                    type_destroy(local_138);
                                                    type_destroy(local_140);
                                                    type_destroy(local_148);
                                                    class_destroy(local_80);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(reflect_object_class_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	// Create class
	hello_world_class hellow_world_cls = new hello_world_class_type();

	EXPECT_NE((void *)NULL, (void *)hellow_world_cls);

	klass cls = class_create("HelloWorld", ACCESSOR_TYPE_STATIC, hellow_world_cls, &hello_world_class_impl_interface_singleton);

	EXPECT_EQ((int)class_increment_reference(cls), (int)0);

	// Register constructors
	constructor default_ctor = constructor_create(0, VISIBILITY_PUBLIC);
	constructor custom_ctor = constructor_create(2, VISIBILITY_PUBLIC);

	ASSERT_NE((constructor)NULL, (constructor)default_ctor);
	ASSERT_NE((constructor)NULL, (constructor)custom_ctor);

	type char_type = type_create(TYPE_CHAR, "char", NULL, NULL);
	type long_type = type_create(TYPE_LONG, "long", NULL, NULL);
	type str_type = type_create(TYPE_STRING, "string", NULL, NULL);
	type int_type = type_create(TYPE_INT, "int", NULL, NULL);
	type float_type = type_create(TYPE_FLOAT, "float", NULL, NULL);

	ASSERT_NE((type)NULL, (type)char_type);
	ASSERT_NE((type)NULL, (type)long_type);
	ASSERT_NE((type)NULL, (type)str_type);
	ASSERT_NE((type)NULL, (type)int_type);
	ASSERT_NE((type)NULL, (type)float_type);

	constructor_set(custom_ctor, 0, "c", char_type);
	constructor_set(custom_ctor, 1, "l", long_type);

	EXPECT_EQ((int)0, (int)class_register_constructor(cls, default_ctor));
	EXPECT_EQ((int)0, (int)class_register_constructor(cls, custom_ctor));

	// Register methods
	method test_func_method = method_create(cls, "test_func", 0, NULL, VISIBILITY_PUBLIC, SYNCHRONOUS, NULL);

	ASSERT_NE((method)NULL, (method)test_func_method);

	signature s = method_signature(test_func_method);

	signature_set_return(s, str_type);

	EXPECT_EQ((int)0, (int)class_register_method(cls, test_func_method));

	// Register static attributes
	attribute a_attr = attribute_create(cls, "a", int_type, NULL, VISIBILITY_PUBLIC, NULL);
	attribute b_attr = attribute_create(cls, "b", float_type, NULL, VISIBILITY_PUBLIC, NULL);
	attribute c_attr = attribute_create(cls, "c", str_type, NULL, VISIBILITY_PUBLIC, NULL);

	ASSERT_NE((attribute)NULL, (attribute)a_attr);
	ASSERT_NE((attribute)NULL, (attribute)b_attr);
	ASSERT_NE((attribute)NULL, (attribute)c_attr);

	EXPECT_EQ((int)0, (int)class_register_static_attribute(cls, a_attr));
	EXPECT_EQ((int)0, (int)class_register_static_attribute(cls, b_attr));
	EXPECT_EQ((int)0, (int)class_register_static_attribute(cls, c_attr));

	// Register attributes
	attribute d_attr = attribute_create(cls, "d", char_type, NULL, VISIBILITY_PUBLIC, NULL);
	attribute e_attr = attribute_create(cls, "e", long_type, NULL, VISIBILITY_PUBLIC, NULL);

	ASSERT_NE((attribute)NULL, (attribute)d_attr);
	ASSERT_NE((attribute)NULL, (attribute)e_attr);

	EXPECT_EQ((int)0, (int)class_register_attribute(cls, d_attr));
	EXPECT_EQ((int)0, (int)class_register_attribute(cls, e_attr));

	// Get and set static attributes from the class
	{
		value a = class_static_get(cls, "a");
		ASSERT_NE((value)NULL, (value)a);
		EXPECT_EQ((int)0, (int)value_to_int(a));
		value_type_destroy(a);

		value b = class_static_get(cls, "b");
		ASSERT_NE((value)NULL, (value)b);
		EXPECT_EQ((float)0.0f, (float)value_to_float(b));
		value_type_destroy(b);

		value c = class_static_get(cls, "c");
		ASSERT_NE((value)NULL, (value)c);
		EXPECT_EQ((char)'\0', (char)*value_to_string(c));
		value_type_destroy(c);

		value new_a = value_create_int(1234);
		ASSERT_EQ((int)0, (int)class_static_set(cls, "a", new_a));
		a = class_static_get(cls, "a");
		EXPECT_NE((value)NULL, (value)a);
		EXPECT_EQ((int)1234, (int)value_to_int(a));
		value_type_destroy(a);
		value_type_destroy(new_a);

		value new_c = value_create_string("hi", 2);

		ASSERT_EQ((int)0, (int)class_static_set(cls, "c", new_c));
		c = class_static_get(cls, "c");
		EXPECT_NE((value)NULL, (value)c);
		EXPECT_EQ((char)'h', (char)value_to_string(c)[0]);
		EXPECT_EQ((char)'i', (char)value_to_string(c)[1]);
		value_type_destroy(c);
		value_type_destroy(new_c);
	}

	// Create object (default constructor)
	{
		value args[] = {
			NULL
		};

		type_id ctor_ids[] = {
			TYPE_INVALID
		};

		constructor ctor = class_constructor(cls, ctor_ids, 0);

		ASSERT_EQ((constructor)ctor, (constructor)default_ctor);

		object obj = class_new(cls, "helloWorldObj", ctor, args, 0);
		ASSERT_NE((object)NULL, (object)obj);

		// Get & set attributes from object
		{
			value d = object_get(obj, "d");
			ASSERT_NE((value)NULL, (value)d);
			EXPECT_EQ((char)'d', (char)value_to_char(d));
			value_type_destroy(d);

			value e = object_get(obj, "e");
			ASSERT_NE((value)NULL, (value)e);
			EXPECT_EQ((long)55L, (long)value_to_long(e));
			value_type_destroy(e);

			value new_d = value_create_char('M');
			ASSERT_EQ((char)0, (char)object_set(obj, "d", new_d));
			d = object_get(obj, "d");
			EXPECT_NE((value)NULL, (value)d);
			EXPECT_EQ((char)'M', (char)value_to_char(d));
			value_type_destroy(d);
			value_type_destroy(new_d);

			value new_e = value_create_long(1234);
			ASSERT_EQ((long)0, (long)object_set(obj, "e", new_e));
			e = object_get(obj, "e");
			EXPECT_NE((value)NULL, (value)e);
			EXPECT_EQ((long)1234L, (long)value_to_long(e));
			value_type_destroy(e);
			value_type_destroy(new_e);
		}

		// Test object call
		type_id method_ids[] = {
			TYPE_INVALID
		};

		method m = class_method(cls, "test_func", TYPE_STRING, method_ids, 0);

		ASSERT_EQ((method)m, (method)test_func_method);

		value ret = object_call(obj, m, args, 0);

		ASSERT_NE((value)NULL, (value)ret);

		ASSERT_EQ((int)0, (int)strcmp(value_to_string(ret), "Hello World"));

		value_type_destroy(ret);

		// TODO: Test object await

		object_destroy(obj);
	}

	// Create object (custom constructor)
	{
		value args[] = {
			value_create_char('F'),
			value_create_long(3435L)
		};

		type_id ctor_ids[] = {
			TYPE_CHAR,
			TYPE_LONG
		};

		constructor ctor = class_constructor(cls, ctor_ids, 2);

		ASSERT_EQ((constructor)ctor, (constructor)custom_ctor);

		object obj = class_new(cls, "helloWorldObj", ctor, args, 2);
		ASSERT_NE((object)NULL, (object)obj);

		value_type_destroy(args[0]);
		value_type_destroy(args[1]);

		// Get attributes from object
		{
			value d = object_get(obj, "d");
			ASSERT_NE((value)NULL, (value)d);
			EXPECT_EQ((char)'F', (char)value_to_char(d));
			value_type_destroy(d);

			value e = object_get(obj, "e");
			ASSERT_NE((value)NULL, (value)e);
			EXPECT_EQ((long)3435L, (long)value_to_long(e));
			value_type_destroy(e);
		}

		// Test object call
		type_id method_ids[] = {
			TYPE_INVALID
		};

		method m = class_method(cls, "test_func", TYPE_STRING, method_ids, 0);

		ASSERT_EQ((method)m, (method)test_func_method);

		value ret = object_call(obj, m, args, 0);

		ASSERT_NE((value)NULL, (value)ret);

		ASSERT_EQ((int)0, (int)strcmp(value_to_string(ret), "Hello World"));

		value_type_destroy(ret);

		// TODO: Test object await

		object_destroy(obj);
	}

	type_destroy(char_type);
	type_destroy(long_type);
	type_destroy(str_type);
	type_destroy(int_type);
	type_destroy(float_type);

	class_destroy(cls);
}